

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Base.cpp
# Opt level: O1

ElementIndexHeader * __thiscall
adios2::format::BP4Base::ReadElementIndexHeader
          (ElementIndexHeader *__return_storage_ptr__,BP4Base *this,
          vector<char,_std::allocator<char>_> *buffer,size_t *position,bool isLittleEndian)

{
  char cVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  pointer pcVar4;
  size_t sVar5;
  uint64_t uVar6;
  string local_50;
  
  (__return_storage_ptr__->GroupName)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->GroupName).field_2;
  (__return_storage_ptr__->GroupName)._M_string_length = 0;
  (__return_storage_ptr__->GroupName).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Name).field_2
  ;
  (__return_storage_ptr__->Name)._M_string_length = 0;
  (__return_storage_ptr__->Name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Path)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Path).field_2
  ;
  (__return_storage_ptr__->Path)._M_string_length = 0;
  (__return_storage_ptr__->Path).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->DataType = 0xfe;
  pcVar4 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  sVar5 = *position;
  uVar3 = *(uint32_t *)(pcVar4 + sVar5);
  *position = sVar5 + 4;
  __return_storage_ptr__->Length = uVar3;
  uVar3 = *(uint32_t *)(pcVar4 + sVar5 + 4);
  *position = sVar5 + 8;
  __return_storage_ptr__->MemberID = uVar3;
  BPBase::ReadBPString_abi_cxx11_
            (&local_50,(BPBase *)((long)&this->_vptr_BP4Base + (long)this->_vptr_BP4Base[-3]),buffer
             ,position,isLittleEndian);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->GroupName,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  BPBase::ReadBPString_abi_cxx11_
            (&local_50,(BPBase *)((long)&this->_vptr_BP4Base + (long)this->_vptr_BP4Base[-3]),buffer
             ,position,isLittleEndian);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->Name,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->Path,0,
             (char *)(__return_storage_ptr__->Path)._M_string_length,0x76b401);
  pcVar4 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  sVar5 = *position;
  cVar1 = pcVar4[sVar5];
  *position = sVar5 + 1;
  __return_storage_ptr__->Order = cVar1;
  *position = sVar5 + 2;
  uVar2 = pcVar4[sVar5 + 2];
  *position = sVar5 + 3;
  __return_storage_ptr__->DataType = uVar2;
  uVar6 = *(uint64_t *)(pcVar4 + sVar5 + 3);
  *position = sVar5 + 0xb;
  __return_storage_ptr__->CharacteristicsSetsCount = uVar6;
  return __return_storage_ptr__;
}

Assistant:

BP4Base::ElementIndexHeader
BP4Base::ReadElementIndexHeader(const std::vector<char> &buffer, size_t &position,
                                const bool isLittleEndian) const noexcept
{
    ElementIndexHeader header;
    header.Length = helper::ReadValue<uint32_t>(buffer, position, isLittleEndian);
    header.MemberID = helper::ReadValue<uint32_t>(buffer, position, isLittleEndian);
    header.GroupName = ReadBPString(buffer, position, isLittleEndian);
    header.Name = ReadBPString(buffer, position, isLittleEndian);
    // header.Path = ReadBP4String(buffer, position, isLittleEndian);
    header.Path = "";
    header.Order = helper::ReadValue<char>(buffer, position, isLittleEndian);
    // uint8_t unused =
    helper::ReadValue<uint8_t>(buffer, position, isLittleEndian);

    header.DataType = helper::ReadValue<int8_t>(buffer, position, isLittleEndian);
    header.CharacteristicsSetsCount = helper::ReadValue<uint64_t>(buffer, position, isLittleEndian);

    return header;
}